

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O0

ServiceServerLinkPtr __thiscall
miniros::ServiceManager::createServiceServerLink
          (ServiceManager *this,string *service,bool persistent,string *request_md5sum,
          string *response_md5sum,M_string *header_values)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  element_type *this_00;
  element_type *this_01;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  byte in_CL;
  socklen_t __len;
  ServiceManager *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  string *in_R8;
  uint32_t *in_R9;
  ServiceServerLinkPtr SVar7;
  ConnectionPtr *in_stack_00000038;
  ServiceServerLink *in_stack_00000040;
  bool enabled;
  scoped_lock<std::mutex> lock;
  ConnectionPtr connection;
  TransportTCPPtr transport;
  string serv_host;
  uint32_t serv_port;
  scoped_lock<std::recursive_mutex> shutdown_lock;
  ServiceServerLinkPtr *client;
  mutex_type *in_stack_fffffffffffffe58;
  function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>
  *in_stack_fffffffffffffe60;
  value_type *in_stack_fffffffffffffe68;
  LogLocation *in_stack_fffffffffffffe70;
  Level in_stack_fffffffffffffe84;
  string *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  void *logger_handle;
  undefined4 in_stack_fffffffffffffea0;
  Level LVar8;
  undefined4 in_stack_fffffffffffffea4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  allocator<char> local_f9;
  string local_f8 [47];
  undefined1 local_c9;
  undefined1 local_c8 [16];
  HeaderReceivedFunc *in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff57;
  TransportPtr *in_stack_ffffffffffffff58;
  Connection *in_stack_ffffffffffffff60;
  string local_60 [32];
  uint local_40;
  undefined4 local_3c;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  std::scoped_lock<std::recursive_mutex>::scoped_lock
            ((scoped_lock<std::recursive_mutex> *)in_stack_fffffffffffffe60,
             (mutex_type *)in_stack_fffffffffffffe58);
  if ((*(byte *)(in_RSI + 0x80) & 1) == 0) {
    std::__cxx11::string::string(local_60);
    bVar2 = lookupService(in_RDX,(string *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),in_R8,in_R9);
    if (bVar2) {
      this_00 = std::
                __shared_ptr_access<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x4aef22);
      PollManager::getPollSet(this_00);
      std::make_shared<miniros::TransportTCP,miniros::PollSet*>
                ((PollSet **)in_stack_fffffffffffffe88);
      std::make_shared<miniros::Connection>();
      std::__shared_ptr_access<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4aef78);
      ConnectionManager::addConnection
                ((ConnectionManager *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (ConnectionPtr *)in_stack_fffffffffffffe98);
      std::__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4aef97);
      std::shared_ptr<miniros::Transport>::shared_ptr<miniros::TransportTCP,void>
                ((shared_ptr<miniros::Transport> *)in_stack_fffffffffffffe60,
                 (shared_ptr<miniros::TransportTCP> *)in_stack_fffffffffffffe58);
      std::function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>::
      function(in_stack_fffffffffffffe60);
      __len = (socklen_t)local_c8;
      Connection::initialize
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57
                 ,in_stack_ffffffffffffff48);
      std::function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>::
      ~function((function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>
                 *)0x4aefed);
      std::shared_ptr<miniros::Transport>::~shared_ptr((shared_ptr<miniros::Transport> *)0x4aeffa);
      this_01 = std::
                __shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x4af007);
      uVar3 = TransportTCP::connect(this_01,(int)local_60,(sockaddr *)(ulong)local_40,__len);
      if ((uVar3 & 1) == 0) {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        LVar8 = (Level)((ulong)in_stack_fffffffffffffe58 >> 0x20);
        if (((createServiceServerLink::loc.initialized_ ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     (char *)in_stack_fffffffffffffe98,(allocator<char> *)in_stack_fffffffffffffe90)
          ;
          console::initializeLogLocation
                    ((LogLocation *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                     in_stack_fffffffffffffe84);
          std::__cxx11::string::~string(local_f8);
          std::allocator<char>::~allocator(&local_f9);
        }
        if (createServiceServerLink::loc.level_ != Debug) {
          console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffffe60,LVar8);
          console::checkLogLocationEnabled(in_stack_fffffffffffffe70);
        }
        if ((createServiceServerLink::loc.logger_enabled_ & 1U) != 0) {
          logger_handle = createServiceServerLink::loc.logger_;
          LVar8 = createServiceServerLink::loc.level_;
          uVar4 = std::__cxx11::string::c_str();
          uVar5 = std::__cxx11::string::c_str();
          uVar6 = std::__cxx11::string::c_str();
          console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar8,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_manager.cpp"
                         ,0x10a,
                         "ServiceServerLinkPtr miniros::ServiceManager::createServiceServerLink(const std::string &, bool, const std::string &, const std::string &, const M_string &)"
                         ,"Failed to connect to service [%s] (mapped=[%s]) at [%s:%d]",uVar4,uVar5,
                         uVar6,local_40);
        }
        std::shared_ptr<miniros::ServiceServerLink>::shared_ptr
                  ((shared_ptr<miniros::ServiceServerLink> *)0x4af3a6);
      }
      else {
        local_c9 = 0;
        std::
        make_shared<miniros::ServiceServerLink,std::__cxx11::string_const&,bool&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                  (in_stack_fffffffffffffea8,
                   (bool *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffe88);
        std::scoped_lock<std::mutex>::scoped_lock
                  ((scoped_lock<std::mutex> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        std::__cxx11::
        list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
        ::push_back((list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                     *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4af0b3);
        std::
        __shared_ptr_access<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4af0c0);
        ServiceServerLink::initialize(in_stack_00000040,in_stack_00000038);
        local_c9 = 1;
      }
      local_3c = 1;
      std::shared_ptr<miniros::Connection>::~shared_ptr((shared_ptr<miniros::Connection> *)0x4af3be)
      ;
      std::shared_ptr<miniros::TransportTCP>::~shared_ptr
                ((shared_ptr<miniros::TransportTCP> *)0x4af3cb);
    }
    else {
      std::shared_ptr<miniros::ServiceServerLink>::shared_ptr
                ((shared_ptr<miniros::ServiceServerLink> *)0x4aeee5);
      local_3c = 1;
    }
    std::__cxx11::string::~string(local_60);
  }
  else {
    std::shared_ptr<miniros::ServiceServerLink>::shared_ptr
              ((shared_ptr<miniros::ServiceServerLink> *)0x4aee78);
    local_3c = 1;
  }
  std::scoped_lock<std::recursive_mutex>::~scoped_lock
            ((scoped_lock<std::recursive_mutex> *)0x4af421);
  SVar7.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  SVar7.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ServiceServerLinkPtr)
         SVar7.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ServiceServerLinkPtr ServiceManager::createServiceServerLink(const std::string& service, bool persistent,
                                             const std::string& request_md5sum, const std::string& response_md5sum,
                                             const M_string& header_values)
{

  std::scoped_lock<std::recursive_mutex> shutdown_lock(shutting_down_mutex_);
  if (shutting_down_)
  {
    return ServiceServerLinkPtr();
  }

  uint32_t serv_port;
  std::string serv_host;
  if (!lookupService(service, serv_host, serv_port))
  {
    return ServiceServerLinkPtr();
  }

  TransportTCPPtr transport(std::make_shared<TransportTCP>(&poll_manager_->getPollSet()));

  // Make sure to initialize the connection *before* transport->connect()
  // is called, otherwise we might miss a connect error (see #434).
  ConnectionPtr connection(std::make_shared<Connection>());
  connection_manager_->addConnection(connection);
  connection->initialize(transport, false, HeaderReceivedFunc());

  if (transport->connect(serv_host, serv_port))
  {
    ServiceServerLinkPtr client(std::make_shared<ServiceServerLink>(service, persistent, request_md5sum, response_md5sum, header_values));

    {
      std::scoped_lock<std::mutex> lock(service_server_links_mutex_);
      service_server_links_.push_back(client);
    }

    client->initialize(connection);

    return client;
  }

  MINIROS_DEBUG("Failed to connect to service [%s] (mapped=[%s]) at [%s:%d]", service.c_str(), service.c_str(), serv_host.c_str(), serv_port);

  return ServiceServerLinkPtr();
}